

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

void __thiscall
Internal_FontDelta::Internal_FontDelta
          (Internal_FontDelta *this,ON_Font *target_font,ON_wString *target_clean_logfont_name,
          ON_wString *target_clean_family_name,ON_Font *candidate_font)

{
  bool bVar1;
  Origin OVar2;
  Weight WVar3;
  Weight WVar4;
  Stretch SVar5;
  Stretch SVar6;
  Style SVar7;
  bool bVar8;
  Style SVar9;
  int iVar10;
  int iVar11;
  wchar_t *string2;
  ON_SHA1_Hash *a;
  ON_SHA1_Hash *b;
  wchar_t *pwVar12;
  bool local_d5;
  bool local_c9;
  int local_c4;
  int local_bc;
  int local_b4;
  bool local_ac;
  bool local_ab;
  bool local_91;
  int name_overlap;
  bool bEqualFamilyName;
  ON_wString candidate_clean_family_name;
  undefined1 local_58 [6];
  bool bEqualLogfontName;
  FontType local_39;
  undefined1 local_38 [7];
  bool bEqualPostScriptName;
  ON_wString target_postscript_name;
  ON_Font *candidate_font_local;
  ON_wString *target_clean_family_name_local;
  ON_wString *target_clean_logfont_name_local;
  ON_Font *target_font_local;
  Internal_FontDelta *this_local;
  
  this->m_candidate_font = candidate_font;
  this->m_hash_delta = 0;
  this->m_family_name_delta = 0;
  this->m_logfont_name_delta = 0;
  this->m_weight_delta = 0;
  this->m_stretch_delta = 0;
  this->m_style_delta = 0;
  this->m_underline_and_strikethrough_delta = 0;
  if (this->m_candidate_font == (ON_Font *)0x0) {
    this->m_hash_delta = 6;
  }
  else {
    target_postscript_name.m_s = (wchar_t *)candidate_font;
    ON_Font::PostScriptName((ON_Font *)local_38);
    candidate_clean_family_name.m_s._7_1_ = 0;
    bVar1 = ON_wString::IsNotEmpty((ON_wString *)local_38);
    local_91 = false;
    if (bVar1) {
      pwVar12 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_38);
      ON_Font::PostScriptName((ON_Font *)local_58);
      candidate_clean_family_name.m_s._7_1_ = 1;
      string2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_58);
      local_91 = ON_wString::EqualOrdinal(pwVar12,string2,true);
    }
    if ((candidate_clean_family_name.m_s._7_1_ & 1) != 0) {
      ON_wString::~ON_wString((ON_wString *)local_58);
    }
    local_39 = local_91;
    local_ab = true;
    if (local_91 == false) {
      OVar2 = ON_Font::FontOrigin(target_font);
      local_ac = false;
      if (OVar2 == WindowsFont) {
        OVar2 = ON_Font::FontOrigin((ON_Font *)target_postscript_name.m_s);
        local_ac = false;
        if (OVar2 == WindowsFont) {
          bVar1 = ON_wString::IsNotEmpty(target_clean_logfont_name);
          local_ac = false;
          if (bVar1) {
            local_ac = Internal_EqualLogfontName
                                 (target_clean_logfont_name,(ON_Font *)target_postscript_name.m_s);
          }
        }
      }
      local_ab = local_ac;
    }
    candidate_clean_family_name.m_s._6_1_ = local_ab;
    if ((local_39 & ManagedFont) == Unset) {
      WVar3 = ON_Font::FontWeight(target_font);
      WVar4 = ON_Font::FontWeight((ON_Font *)target_postscript_name.m_s);
      local_b4 = (uint)WVar3 - (uint)WVar4;
      if (local_b4 < 1) {
        local_b4 = -local_b4;
      }
    }
    else {
      local_b4 = 0;
    }
    this->m_weight_delta = local_b4;
    if ((local_39 & ManagedFont) == Unset) {
      SVar5 = ON_Font::FontStretch(target_font);
      SVar6 = ON_Font::FontStretch((ON_Font *)target_postscript_name.m_s);
      local_bc = (uint)SVar5 - (uint)SVar6;
      if (local_bc < 1) {
        local_bc = -local_bc;
      }
    }
    else {
      local_bc = 0;
    }
    this->m_stretch_delta = local_bc;
    if ((local_39 & ManagedFont) == Unset) {
      SVar9 = ON_Font::FontStyle(target_font);
      SVar7 = ON_Font::FontStyle((ON_Font *)target_postscript_name.m_s);
      local_c4 = (uint)SVar9 - (uint)SVar7;
      if (local_c4 < 1) {
        local_c4 = -local_c4;
      }
    }
    else {
      local_c4 = 0;
    }
    this->m_style_delta = local_c4;
    ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffff98);
    local_c9 = true;
    if ((candidate_clean_family_name.m_s._6_1_ & 1) == 0) {
      local_c9 = Internal_EqualFamilyName
                           (target_clean_family_name,(ON_Font *)target_postscript_name.m_s,
                            (ON_wString *)&stack0xffffffffffffff98);
    }
    bVar1 = ON_Font::IsUnderlined(target_font);
    bVar8 = ON_Font::IsUnderlined((ON_Font *)target_postscript_name.m_s);
    if (bVar1 != bVar8) {
      this->m_underline_and_strikethrough_delta = this->m_underline_and_strikethrough_delta + 1;
    }
    bVar1 = ON_Font::IsStrikethrough(target_font);
    bVar8 = ON_Font::IsStrikethrough((ON_Font *)target_postscript_name.m_s);
    if (bVar1 != bVar8) {
      this->m_underline_and_strikethrough_delta = this->m_underline_and_strikethrough_delta + 1;
    }
    this->m_family_name_delta = 0;
    if ((((local_c9 == false) || (this->m_weight_delta != 0)) || (this->m_stretch_delta != 0)) ||
       (this->m_style_delta != 0)) {
      if ((((candidate_clean_family_name.m_s._6_1_ & 1) == 0) || (this->m_stretch_delta != 0)) ||
         (1 < this->m_style_delta)) {
        if (local_c9 == false) {
          pwVar12 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff98);
          iVar10 = Internal_NameOverLap(target_clean_family_name,pwVar12,true);
          iVar11 = ON_wString::Length(target_clean_family_name);
          this->m_family_name_delta = iVar11 - iVar10;
          if (this->m_family_name_delta == 0) {
            iVar10 = ON_wString::Length(target_clean_family_name);
            iVar11 = ON_wString::Length((ON_wString *)&stack0xffffffffffffff98);
            this->m_family_name_delta = iVar10 - iVar11;
          }
          bVar1 = true;
          if (this->m_style_delta != 0) {
            SVar9 = ON_Font::FontStyle(target_font);
            bVar1 = SVar9 != Upright;
          }
          iVar10 = 5;
          if (bVar1) {
            iVar10 = 4;
          }
          this->m_hash_delta = iVar10;
        }
        else {
          this->m_hash_delta = 3;
        }
      }
      else {
        this->m_hash_delta = 2;
      }
    }
    else {
      local_d5 = false;
      if (this->m_underline_and_strikethrough_delta == 0) {
        a = ON_Font::FontCharacteristicsHash(target_font);
        b = ON_Font::FontCharacteristicsHash((ON_Font *)target_postscript_name.m_s);
        local_d5 = ::operator==(a,b);
      }
      this->m_hash_delta = (uint)(local_d5 == false);
    }
    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff98);
    ON_wString::~ON_wString((ON_wString *)local_38);
  }
  return;
}

Assistant:

Internal_FontDelta(
    const ON_Font& target_font,
    const ON_wString& target_clean_logfont_name,
    const ON_wString& target_clean_family_name,
    const ON_Font* candidate_font
  )
    : m_candidate_font(candidate_font)
  {
    if (nullptr == m_candidate_font)
    {
      m_hash_delta = 6;
      return;
    }

    // When we have identical PostScript names, we assume they
    // are correct and assume font family, weight, stretch, and style 
    // are exact matches.
    const ON_wString target_postscript_name = target_font.PostScriptName();
    const bool bEqualPostScriptName
      = target_postscript_name.IsNotEmpty()
      && ON_wString::EqualOrdinal(target_postscript_name, m_candidate_font->PostScriptName(), true);

    const bool bEqualLogfontName
      = bEqualPostScriptName
      || (
         ON_Font::Origin::WindowsFont == target_font.FontOrigin()
         && ON_Font::Origin::WindowsFont == candidate_font->FontOrigin()
         && target_clean_logfont_name.IsNotEmpty()
         && Internal_EqualLogfontName(target_clean_logfont_name, candidate_font)
         );

    m_weight_delta 
      = bEqualPostScriptName
      ? 0
      : abs(((int)static_cast<unsigned int>(target_font.FontWeight())) - ((int)static_cast<unsigned int>(candidate_font->FontWeight())));
    m_stretch_delta 
      = bEqualPostScriptName
      ? 0
      : abs(((int)static_cast<unsigned int>(target_font.FontStretch())) - ((int)static_cast<unsigned int>(candidate_font->FontStretch())));
    m_style_delta 
      = bEqualPostScriptName
      ? 0
      : abs(((int)static_cast<unsigned int>(target_font.FontStyle())) - ((int)static_cast<unsigned int>(candidate_font->FontStyle())));

    ON_wString candidate_clean_family_name;
    const bool bEqualFamilyName 
      = bEqualLogfontName 
      || Internal_EqualFamilyName(target_clean_family_name, candidate_font, candidate_clean_family_name);      

    if (target_font.IsUnderlined() != candidate_font->IsUnderlined())
      m_underline_and_strikethrough_delta++;
    if (target_font.IsStrikethrough() != candidate_font->IsStrikethrough())
      m_underline_and_strikethrough_delta++;

    m_family_name_delta = 0;


    if (
      bEqualFamilyName
      && 0 == m_weight_delta
      && 0 == m_stretch_delta
      && 0 == m_style_delta
      )
    {
      // This is either an exact match (m_hash_delta = 0) or a very close match (m_hash_delta = 1).
      m_hash_delta 
        = (0 == m_underline_and_strikethrough_delta && target_font.FontCharacteristicsHash() == candidate_font->FontCharacteristicsHash()) 
        ? 0
        : 1;
      return;
    }

    // If PANOSE information were available for target_font and candidate_font, it would be useful here.

    if (
      bEqualLogfontName 
      && 0 == m_stretch_delta 
      && m_style_delta <= 1
      )
    {
      // There are at most 4 "faces" with the same WINDOWS LOGFONT.lfFaceName and the differences
      // among the four "faces" are almost always in weight (normal or bold) or style (upright or italic). 
      // Fonts with larger differences in weight or style or any significant difference in stretch 
      // typically have different values of LOGFONT.lfFaceName.
      // (Underlined and Strikethrough are not "faces").
      m_hash_delta = 2;
      return;
    }

    if (bEqualFamilyName)
    {
      // A family, like "Arial", can have manu faces with a wide variety of weights, stretches, and styles.
      // The LOGFONTs with lfFaceName = "Arial", "Arial Narrow", "Arial Black", ... are all in the "Arial" family.
      m_hash_delta = 3;
      return;
    }

    // Differences below here (m_hash_delta >= 4) are generally visually significant.
    // Calculate font family name overlap
    int name_overlap = Internal_NameOverLap(target_clean_family_name, candidate_clean_family_name, true);
    m_family_name_delta = target_clean_family_name.Length() - name_overlap;
    if (0 == m_family_name_delta)
    {
      // clean_font_family_name.Length() = name_overlap means that
      // clean_font_family_name.Length() <= installed_font_family_name.Length()
      // and installed_font_family_name begins with clean_font_family_name.
      // If installed_font_family_name.Length() > clean_font_family_name.Length(),
      // m_name_delta < 0 and it measures how much tail was not matched
      m_family_name_delta = target_clean_family_name.Length() - candidate_clean_family_name.Length();
    }

    m_hash_delta 
      = (0 == m_style_delta || ON_Font::Style::Upright != target_font.FontStyle())
      ? 4
      : 5;
  }